

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

size_t lddmc_serialize_get(MDD mdd)

{
  lddmc_ser *plVar1;
  lddmc_ser *ss;
  lddmc_ser s;
  MDD mdd_local;
  
  mdd_local = mdd;
  if (1 < mdd) {
    ss = (lddmc_ser *)mdd;
    s.assigned = mdd;
    plVar1 = lddmc_ser_search(lddmc_ser_set,(lddmc_ser *)&ss);
    if (plVar1 == (lddmc_ser *)0x0) {
      __assert_fail("ss != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0x9cb,"size_t lddmc_serialize_get(MDD)");
    }
    mdd_local = plVar1->assigned;
  }
  return mdd_local;
}

Assistant:

size_t
lddmc_serialize_get(MDD mdd)
{
    if (mdd <= lddmc_true) return mdd;
    struct lddmc_ser s, *ss;
    s.mdd = mdd;
    ss = lddmc_ser_search(lddmc_ser_set, &s);
    assert(ss != NULL);
    return ss->assigned;
}